

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::prepareForInsert
          (NumberStringBuilder *this,int32_t index,int32_t count,UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  
  if ((index == 0) && (iVar1 = this->fZero - count, -1 < iVar1)) {
    this->fZero = iVar1;
    this->fLength = this->fLength + count;
    return iVar1;
  }
  if (this->fLength == index) {
    if (this->fUsingHeap == false) {
      iVar2 = 0x28;
    }
    else {
      iVar2 = (this->fChars).heap.capacity;
    }
    if (index + count + this->fZero < iVar2) {
      this->fLength = index + count;
      return this->fZero + index;
    }
  }
  iVar2 = prepareForInsertHelper(this,index,count,status);
  return iVar2;
}

Assistant:

int32_t NumberStringBuilder::prepareForInsert(int32_t index, int32_t count, UErrorCode &status) {
    U_ASSERT(index >= 0);
    U_ASSERT(index <= fLength);
    U_ASSERT(count >= 0);
    if (index == 0 && fZero - count >= 0) {
        // Append to start
        fZero -= count;
        fLength += count;
        return fZero;
    } else if (index == fLength && fZero + fLength + count < getCapacity()) {
        // Append to end
        fLength += count;
        return fZero + fLength - count;
    } else {
        // Move chars around and/or allocate more space
        return prepareForInsertHelper(index, count, status);
    }
}